

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

char * __thiscall google::protobuf::internal::LongSooRep::elements(LongSooRep *this)

{
  Nonnull<const_char_*> pcVar1;
  char *pcVar2;
  
  pcVar2 = (char *)(this->elements_int & 0xfffffffffffffff8);
  if (pcVar2 == (char *)0x0) {
    pcVar1 = absl::lts_20250127::log_internal::MakeCheckOpString<char_const*,void_const*>
                       ((char *)0x0,(void *)0x0,"ret != nullptr");
  }
  else {
    pcVar1 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar1 == (Nonnull<const_char_*>)0x0) {
    return pcVar2;
  }
  elements();
}

Assistant:

char* elements() const {
    auto ret = reinterpret_cast<char*>(elements_int & kSooPtrMask);
    ABSL_DCHECK_NE(ret, nullptr);
    return ret;
  }